

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<google::protobuf::descriptor_unittest::HasHasbitTestParam>::Iterator_const,testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam>const>
          (ParamIteratorInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam> *base)

{
  long lVar1;
  bool bVar2;
  GTestLog local_c;
  
  if (base == (ParamIteratorInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam> *)
              0x0) {
    bVar2 = true;
  }
  else {
    lVar1 = __dynamic_cast(base,&ParamIteratorInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam>
                                 ::typeinfo,
                           &ValuesInIteratorRangeGenerator<google::protobuf::descriptor_unittest::HasHasbitTestParam>
                            ::Iterator::typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  bVar2 = IsTrue(bVar2);
  if (!bVar2) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x4aa);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ",0x4d)
    ;
    GTestLog::~GTestLog(&local_c);
  }
  return (Iterator *)base;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}